

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpParser.cpp
# Opt level: O0

string * __thiscall
TgBot::HttpParser::generateMultipartFormData
          (string *__return_storage_ptr__,HttpParser *this,
          vector<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_> *args,string *bondary)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  reference local_50;
  HttpReqArg *item;
  const_iterator __end1;
  const_iterator __begin1;
  vector<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_> *__range1;
  string *bondary_local;
  vector<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_> *args_local;
  HttpParser *this_local;
  string *result;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  __end1 = std::vector<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>::begin(args);
  item = (HttpReqArg *)std::vector<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>::end(args)
  ;
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_TgBot::HttpReqArg_*,_std::vector<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>_>
                                     *)&item), bVar1) {
    local_50 = __gnu_cxx::
               __normal_iterator<const_TgBot::HttpReqArg_*,_std::vector<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>_>
               ::operator*(&__end1);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"--");
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)bondary);
    std::__cxx11::string::operator+=
              ((string *)__return_storage_ptr__,"\r\nContent-Disposition: form-data; name=\"");
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)local_50);
    if ((local_50->isFile & 1U) != 0) {
      std::operator+(&local_80,"\"; filename=\"",&local_50->fileName);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_80);
      std::__cxx11::string::~string((string *)&local_80);
    }
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\"\r\n");
    if ((local_50->isFile & 1U) != 0) {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"Content-Type: ");
      std::__cxx11::string::operator+=
                ((string *)__return_storage_ptr__,(string *)&local_50->mimeType);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\r\n");
    }
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\r\n");
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_50->value);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\r\n");
    __gnu_cxx::
    __normal_iterator<const_TgBot::HttpReqArg_*,_std::vector<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>_>
    ::operator++(&__end1);
  }
  std::operator+(&local_c0,"--",bondary);
  std::operator+(&local_a0,&local_c0,"--\r\n");
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  return __return_storage_ptr__;
}

Assistant:

string HttpParser::generateMultipartFormData(const vector<HttpReqArg>& args, const string& bondary) const {
    string result;
    for (const HttpReqArg& item : args) {
        result += "--";
        result += bondary;
        result += "\r\nContent-Disposition: form-data; name=\"";
        result += item.name;
        if (item.isFile) {
            result += "\"; filename=\"" + item.fileName;
        }
        result += "\"\r\n";
        if (item.isFile) {
            result += "Content-Type: ";
            result += item.mimeType;
            result += "\r\n";
        }
        result += "\r\n";
        result += item.value;
        result += "\r\n";
    }
    result += "--" + bondary + "--\r\n";
    return result;
}